

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O3

int match_capture_common(compiler_common *common,int stacksize,int offset,int private_data_ptr)

{
  int iVar1;
  sljit_compiler *compiler;
  sljit_u8 *psVar2;
  
  compiler = common->compiler;
  iVar1 = common->capture_last_ptr;
  if ((long)iVar1 != 0) {
    if (compiler->error == 0) {
      compiler->mode32 = 0;
      psVar2 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar1);
      if (psVar2 != (sljit_u8 *)0x0) {
        *psVar2 = 0x8b;
      }
      if (compiler->error == 0) {
        iVar1 = common->capture_last_ptr;
        compiler->mode32 = 0;
        emit_mov(compiler,0x8e,(long)iVar1,0x40,(ulong)((uint)offset >> 1));
        if (compiler->error == 0) {
          match_capture_common_cold_1();
        }
      }
    }
    stacksize = stacksize + 1;
  }
  if (common->optimized_cbracket[(uint)offset >> 1] == '\0') {
    if (compiler->error == 0) {
      iVar1 = common->ovector_start;
      compiler->mode32 = 0;
      psVar2 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)iVar1 + (ulong)(uint)offset * 8);
      if (psVar2 != (sljit_u8 *)0x0) {
        *psVar2 = 0x8b;
      }
      if (compiler->error == 0) {
        iVar1 = common->ovector_start;
        compiler->mode32 = 0;
        psVar2 = emit_x86_instruction(compiler,1,4,0,0x8e,(long)iVar1 + (ulong)(uint)offset * 8 + 8)
        ;
        if (psVar2 != (sljit_u8 *)0x0) {
          *psVar2 = 0x8b;
        }
        if (compiler->error == 0) {
          compiler->mode32 = 0;
          psVar2 = emit_x86_instruction(compiler,1,1,0,0x8c,(long)(stacksize * 8));
          if (psVar2 != (sljit_u8 *)0x0) {
            *psVar2 = 0x89;
          }
          if (compiler->error == 0) {
            compiler->mode32 = 0;
            psVar2 = emit_x86_instruction(compiler,1,1,0,0x8e,(long)private_data_ptr);
            if (psVar2 != (sljit_u8 *)0x0) {
              *psVar2 = 0x8b;
            }
            if (compiler->error == 0) {
              compiler->mode32 = 0;
              psVar2 = emit_x86_instruction(compiler,1,4,0,0x8c,(long)(stacksize * 8 + 8));
              if (psVar2 != (sljit_u8 *)0x0) {
                *psVar2 = 0x89;
              }
              if (compiler->error == 0) {
                match_capture_common_cold_2();
              }
            }
          }
        }
      }
    }
    stacksize = stacksize + 2;
  }
  return stacksize;
}

Assistant:

static SLJIT_INLINE int match_capture_common(compiler_common *common, int stacksize, int offset, int private_data_ptr)
{
DEFINE_COMPILER;

if (common->capture_last_ptr != 0)
  {
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), common->capture_last_ptr);
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), common->capture_last_ptr, SLJIT_IMM, offset >> 1);
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(stacksize), TMP1, 0);
  stacksize++;
  }
if (common->optimized_cbracket[offset >> 1] == 0)
  {
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
  OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(stacksize), TMP1, 0);
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), private_data_ptr);
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(stacksize + 1), TMP2, 0);
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1), STR_PTR, 0);
  OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset), TMP1, 0);
  stacksize += 2;
  }
return stacksize;
}